

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O3

int Fraig_NodeVecPushUniqueOrder(Fraig_NodeVec_t *p,Fraig_Node_t *pNode)

{
  long lVar1;
  
  if (0 < (long)p->nSize) {
    lVar1 = 0;
    do {
      if (p->pArray[lVar1] == pNode) {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (p->nSize != lVar1);
  }
  Fraig_NodeVecPushOrder(p,pNode);
  return 0;
}

Assistant:

int Fraig_NodeVecPushUniqueOrder( Fraig_NodeVec_t * p, Fraig_Node_t * pNode )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == pNode )
            return 1;
    Fraig_NodeVecPushOrder( p, pNode );
    return 0;
}